

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O1

void __thiscall icu_63::UnicodeSetStringSpan::~UnicodeSetStringSpan(UnicodeSetStringSpan *this)

{
  UnicodeSet *this_00;
  int32_t *buffer;
  void *in_RSI;
  
  this_00 = this->pSpanNotSet;
  if (this_00 != &this->spanSet && this_00 != (UnicodeSet *)0x0) {
    UnicodeSet::~UnicodeSet(this_00);
    UMemory::operator_delete((UMemory *)this_00,in_RSI);
  }
  buffer = this->utf8Lengths;
  if (buffer != this->staticLengths && buffer != (int32_t *)0x0) {
    uprv_free_63(buffer);
  }
  UnicodeSet::~UnicodeSet(&this->spanSet);
  return;
}

Assistant:

UnicodeSetStringSpan::~UnicodeSetStringSpan() {
    if(pSpanNotSet!=NULL && pSpanNotSet!=&spanSet) {
        delete pSpanNotSet;
    }
    if(utf8Lengths!=NULL && utf8Lengths!=staticLengths) {
        uprv_free(utf8Lengths);
    }
}